

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_PitchDetector.cpp
# Opt level: O0

int PitchDetector::ReleaseCallback(UnityAudioEffectState *state)

{
  EffectData *pEVar1;
  Data *data;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<PitchDetector::EffectData>(state);
  if (pEVar1 != (EffectData *)0x0) {
    operator_delete(pEVar1,0x2002c);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ReleaseCallback(UnityAudioEffectState* state)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        delete data;
        return UNITY_AUDIODSP_OK;
    }